

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

essential_t *
opengv::relative_pose::eightpt
          (essential_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  size_t rows;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Index IVar16;
  int iVar17;
  long lVar18;
  undefined8 *puVar19;
  int iVar20;
  size_t sVar21;
  size_t sVar22;
  Index index;
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  double *pdVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  Index size;
  MatrixXd A;
  MatrixXd F_temp;
  Matrix<double,_9,_1,_0,_9,_1> f;
  Matrix3d S;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD2;
  DenseStorage<double,__1,__1,__1,_0> local_678;
  DenseStorage<double,__1,__1,__1,_0> local_658;
  ulong local_638;
  undefined1 (*local_630) [16];
  double local_628 [4];
  double local_608;
  double dStack_600;
  double local_5f8 [2];
  double local_5e8 [2];
  DenseStorage<double,__1,__1,__1,_0> local_5d8;
  undefined8 uStack_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined1 local_5a8 [16];
  double local_598;
  double adStack_580 [7];
  undefined8 uStack_548;
  undefined8 uStack_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  double local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  double adStack_510 [2];
  undefined1 local_500 [64];
  double local_4c0;
  undefined1 local_4b8 [64];
  undefined8 local_478;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_470;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_250;
  
  rows = indices->_numberCorrespondences;
  local_678.m_cols = 0;
  local_678.m_data = (double *)0x0;
  local_678.m_rows = 0;
  if (0xe38e38e38e38e38 < (long)rows) {
    puVar19 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar19 = acos;
    __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_678,rows * 9,rows,9);
  if (rows != 0) {
    lVar25 = 0;
    sVar21 = 0;
    do {
      iVar20 = (int)sVar21;
      iVar17 = iVar20;
      if (indices->_useIndices != false) {
        iVar17 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar25 >> 0x1e));
      }
      (*adapter->_vptr_RelativeAdapterBase[3])(&local_470,adapter,(long)iVar17);
      if (indices->_useIndices != false) {
        iVar20 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar25 >> 0x1e));
      }
      (*adapter->_vptr_RelativeAdapterBase[2])(&local_250,adapter,(long)iVar20);
      local_678.m_data[sVar21] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data;
      sVar22 = sVar21 + 1;
      local_678.m_data[sVar21 + local_678.m_rows] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
      local_678.m_data[sVar21 + local_678.m_rows * 2] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
      local_678.m_data[sVar21 + local_678.m_rows * 3] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data;
      local_678.m_data[sVar21 + local_678.m_rows * 4] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
      local_678.m_data[sVar21 + local_678.m_rows * 5] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
      local_678.m_data[sVar21 + local_678.m_rows * 6] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data;
      local_678.m_data[sVar21 + local_678.m_rows * 7] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
      local_678.m_data[sVar21 + local_678.m_rows * 8] =
           (double)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols *
           (double)local_470.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
      lVar25 = lVar25 + 0x100000000;
      sVar21 = sVar22;
    } while (rows != sVar22);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_470,(MatrixType *)&local_678,0x14);
  local_628[0] = local_470.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_470.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 8];
  local_628[1] = (local_470.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                 local_470.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 8)[1];
  local_628[2] = local_470.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_470.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 8 + 2];
  local_628[3] = (local_470.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                 local_470.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 8 + 2)[1];
  local_608 = local_470.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[local_470.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 8 + 4];
  dStack_600 = (local_470.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data +
               local_470.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows * 8 + 4)[1];
  local_5f8[0] = local_470.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_470.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 8 + 6];
  local_5f8[1] = (local_470.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data +
                 local_470.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 8 + 6)[1];
  local_5e8[0] = local_470.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_470.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 8 + 8];
  local_658.m_cols = 0;
  local_658.m_data = (double *)0x0;
  local_658.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_658,9,3,3);
  IVar16 = local_658.m_rows;
  pdVar27 = local_658.m_data;
  uVar24 = local_658.m_rows;
  if ((((ulong)local_658.m_data & 7) == 0) &&
     (uVar24 = (ulong)(-((uint)((ulong)local_658.m_data >> 3) & 0x1fffffff) & 7),
     local_658.m_rows <= (long)uVar24)) {
    uVar24 = local_658.m_rows;
  }
  uVar28 = local_658.m_rows - uVar24;
  uVar29 = uVar28 + 7;
  if (-1 < (long)uVar28) {
    uVar29 = uVar28;
  }
  if (0 < (long)uVar24) {
    memcpy(local_658.m_data,local_628,uVar24 * 8);
  }
  lVar25 = (uVar29 & 0xfffffffffffffff8) + uVar24;
  if (7 < (long)uVar28) {
    lVar18 = uVar24 + 8;
    if ((long)(uVar24 + 8) < lVar25) {
      lVar18 = lVar25;
    }
    memcpy(pdVar27 + uVar24,local_628 + uVar24,(~uVar24 + lVar18 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  if (lVar25 < IVar16) {
    memcpy(pdVar27 + uVar24 + ((long)uVar29 >> 3) * 8,local_628 + uVar24 + ((long)uVar29 >> 3) * 8,
           ((long)uVar28 % 8) * 8);
  }
  pauVar23 = (undefined1 (*) [16])(pdVar27 + IVar16);
  uVar24 = IVar16;
  if ((((ulong)pauVar23 & 7) == 0) &&
     (uVar24 = (ulong)(-((uint)((ulong)pauVar23 >> 3) & 0x1fffffff) & 7), IVar16 <= (long)uVar24)) {
    uVar24 = IVar16;
  }
  uVar28 = IVar16 - uVar24;
  uVar29 = uVar28 + 7;
  if (-1 < (long)uVar28) {
    uVar29 = uVar28;
  }
  if (0 < (long)uVar24) {
    memcpy(pauVar23,local_628 + 3,uVar24 * 8);
  }
  lVar25 = (uVar29 & 0xfffffffffffffff8) + uVar24;
  local_630 = pauVar23;
  if (7 < (long)uVar28) {
    lVar18 = uVar24 + 8;
    if ((long)(uVar24 + 8) < lVar25) {
      lVar18 = lVar25;
    }
    memcpy(pdVar27 + uVar24 + IVar16,local_628 + uVar24 + 3,
           (~uVar24 + lVar18 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  if (lVar25 < IVar16) {
    memcpy(pdVar27 + uVar24 + ((long)uVar29 >> 3) * 8 + IVar16,
           local_628 + uVar24 + ((long)uVar29 >> 3) * 8 + 3,((long)uVar28 % 8) * 8);
  }
  pauVar23 = (undefined1 (*) [16])(pdVar27 + IVar16 * 2);
  uVar24 = IVar16;
  if ((((ulong)pauVar23 & 7) == 0) &&
     (uVar24 = (ulong)(-((uint)((ulong)pauVar23 >> 3) & 0x1fffffff) & 7), IVar16 <= (long)uVar24)) {
    uVar24 = IVar16;
  }
  uVar28 = IVar16 - uVar24;
  uVar29 = uVar28 + 7;
  if (-1 < (long)uVar28) {
    uVar29 = uVar28;
  }
  uVar26 = uVar29 & 0xfffffffffffffff8;
  if (0 < (long)uVar24) {
    memcpy(pauVar23,local_5f8,uVar24 * 8);
  }
  lVar25 = uVar26 + uVar24;
  local_638 = uVar26;
  if (7 < (long)uVar28) {
    lVar18 = uVar24 + 8;
    if ((long)(uVar24 + 8) < lVar25) {
      lVar18 = lVar25;
    }
    memcpy(*pauVar23 + uVar24 * 8,local_5f8 + uVar24,
           (~uVar24 + lVar18 & 0xfffffffffffffff8) * 8 + 0x40);
  }
  if (lVar25 < IVar16) {
    memcpy(pauVar23[((long)uVar29 >> 3) * 4] + uVar24 * 8,
           local_5e8 + ((long)uVar29 >> 3) * 8 + (uVar24 - 2),(uVar28 - local_638) * 8);
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = pdVar27[2];
  vbroadcastsd_avx512f(auVar4);
  vpermt2pd_avx512f(_DAT_002504c0,ZEXT1664(*local_630));
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)local_630[1];
  vbroadcastsd_avx512f(auVar31);
  local_4b8 = vpermt2pd_avx512f(_DAT_00250500,ZEXT1664(*pauVar23));
  local_478 = *(undefined8 *)pauVar23[1];
  local_5d8.m_cols = 0;
  local_5d8.m_data = (double *)0x0;
  local_5d8.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_5d8,9,3,3);
  if ((local_5d8.m_rows == 3) && (local_5d8.m_cols == 3)) {
    uVar29 = 9;
    uVar24 = 8;
  }
  else {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_5d8,9,3,3);
    uVar29 = local_5d8.m_cols * local_5d8.m_rows;
    uVar24 = uVar29 + 7;
    if (-1 < (long)uVar29) {
      uVar24 = uVar29;
    }
    uVar24 = uVar24 & 0xfffffffffffffff8;
    pdVar27 = local_5d8.m_data;
    if ((long)uVar29 < 8) goto LAB_00130da1;
  }
  pdVar27 = local_5d8.m_data;
  uVar28 = 8;
  if (8 < (long)uVar24) {
    uVar28 = uVar24;
  }
  memcpy(local_5d8.m_data,local_4b8,uVar28 * 8);
LAB_00130da1:
  if ((long)uVar24 < (long)uVar29) {
    do {
      pdVar27[uVar24] = *(double *)(local_4b8 + uVar24 * 8);
      uVar24 = uVar24 + 1;
    } while (uVar29 != uVar24);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_250,(MatrixType *)&local_5d8,0x14);
  if (local_5d8.m_data != (double *)0x0) {
    free((void *)local_5d8.m_data[-1]);
  }
  adStack_580[3] = 0.0;
  adStack_580[4] = 0.0;
  adStack_580[5] = 0.0;
  uStack_548 = 0;
  uStack_540 = 0;
  uStack_538 = 0;
  uStack_530 = 0;
  adStack_580[2] =
       *local_250.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
        m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_data;
  adStack_580[6] =
       local_250.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
       m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data[1];
  dVar10 = *(double *)
            *(undefined1 (*) [16])
             ((long)local_250.
                    super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                    m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data + 0x10);
  auVar4 = *(undefined1 (*) [16])
            local_250.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
            m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data;
  local_528 = dVar10;
  uStack_520 = *(undefined8 *)
                (*(undefined1 (*) [16])
                  ((long)local_250.
                         super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                         .m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                         .m_storage.m_data + 0x10) + 8);
  local_518 = *(undefined8 *)
               ((undefined1 *)
                local_250.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data +
               local_250.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows * 8 + 8);
  dVar11 = *(double *)
            ((long)((undefined1 *)
                    local_250.
                    super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                    m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data +
                   local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows * 8 + 8) + 8);
  adStack_510[0] = dVar11;
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       local_250.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
       m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       [2];
  vbroadcastsd_avx512f(auVar30);
  vpermt2pd_avx512f(_DAT_002504c0,
                    ZEXT1664(*(undefined1 (*) [16])
                              (local_250.
                               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                               .m_matrixV.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_data +
                              local_250.
                              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                              .m_matrixV.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_rows)));
  auVar31 = *(undefined1 (*) [16])
             ((long)local_250.
                    super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                    m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data +
             local_250.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows * 0x10);
  dVar1 = *(double *)
           *(undefined1 (*) [16])
            ((long)local_250.
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data +
            (local_250.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows + 1) * 0x10);
  lVar25 = 0x10;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_250.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data
                 [local_250.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows + 2];
  vbroadcastsd_avx512f(auVar5);
  local_500 = vpermt2pd_avx512f(_DAT_00250500,
                                ZEXT1664(*(undefined1 (*) [16])
                                          (local_250.
                                           super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                                           .m_matrixV.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                           .m_storage.m_data +
                                          local_250.
                                          super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                                          .m_matrixV.
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                          .m_storage.m_rows * 2)));
  local_4c0 = local_250.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data[local_250.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 2 + 2];
  auVar15._8_8_ = local_518;
  auVar15._0_8_ =
       *(undefined8 *)
        (*(undefined1 (*) [16])
          ((long)local_250.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data + 0x10) + 8);
  do {
    auVar6._8_8_ = *(undefined8 *)((long)adStack_580 + lVar25);
    auVar6._0_8_ = *(undefined8 *)((long)adStack_580 + lVar25);
    auVar30 = vmulpd_avx512vl(auVar4,auVar6);
    dVar2 = *(double *)((long)adStack_580 + lVar25 + 0x10);
    auVar32._8_8_ = dVar2;
    auVar32._0_8_ = dVar2;
    uVar3 = *(undefined8 *)((long)adStack_580 + lVar25 + 8);
    auVar7._8_8_ = uVar3;
    auVar7._0_8_ = uVar3;
    auVar30 = vfmadd231pd_avx512vl(auVar30,auVar15,auVar7);
    auVar30 = vfmadd231pd_fma(auVar30,auVar31,auVar32);
    *(undefined1 (*) [16])((long)local_5e8 + lVar25) = auVar30;
    auVar34._0_8_ = dVar10 * *(double *)((long)adStack_580 + lVar25);
    auVar34._8_8_ = dVar11 * *(double *)((long)adStack_580 + lVar25 + 8);
    auVar30 = vshufpd_avx(auVar34,auVar34,1);
    *(double *)((long)&local_5d8.m_data + lVar25) = auVar34._0_8_ + auVar30._0_8_ + dVar1 * dVar2;
    lVar25 = lVar25 + 0x18;
  } while (lVar25 != 0x58);
  auVar13._8_8_ = uStack_5c0;
  auVar13._0_8_ = local_5d8.m_cols;
  auVar12._8_8_ = local_5d8.m_rows;
  auVar12._0_8_ = local_5d8.m_data;
  auVar14._8_8_ = uStack_5b8;
  auVar14._0_8_ = uStack_5c0;
  lVar25 = 0x10;
  auVar4 = vmovhpd_avx(auVar13,local_5b0);
  do {
    auVar8._8_8_ = *(undefined8 *)((long)adStack_510 + lVar25);
    auVar8._0_8_ = *(undefined8 *)((long)adStack_510 + lVar25);
    auVar31 = vmulpd_avx512vl(auVar12,auVar8);
    dVar1 = *(double *)(local_500 + lVar25);
    auVar33._8_8_ = dVar1;
    auVar33._0_8_ = dVar1;
    auVar35._0_8_ = auVar4._0_8_ * *(double *)((long)adStack_510 + lVar25);
    auVar35._8_8_ = auVar4._8_8_ * *(double *)((long)adStack_510 + lVar25 + 8);
    uVar3 = *(undefined8 *)((long)adStack_510 + lVar25 + 8);
    auVar9._8_8_ = uVar3;
    auVar9._0_8_ = uVar3;
    auVar31 = vfmadd231pd_avx512vl(auVar31,auVar14,auVar9);
    auVar31 = vfmadd231pd_fma(auVar31,local_5a8,auVar33);
    *(undefined1 (*) [16])
     ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
            m_storage.m_data.array + lVar25 + -0x10) = auVar31;
    auVar31 = vshufpd_avx(auVar35,auVar35,1);
    *(double *)
     ((long)(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
            m_storage.m_data.array + lVar25) = auVar35._0_8_ + auVar31._0_8_ + local_598 * dVar1;
    lVar25 = lVar25 + 0x18;
  } while (lVar25 != 0x58);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_250);
  if (local_658.m_data != (double *)0x0) {
    free((void *)local_658.m_data[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_470);
  if (local_678.m_data != (double *)0x0) {
    free((void *)local_678.m_data[-1]);
  }
  return __return_storage_ptr__;
}

Assistant:

opengv::rotation_t
opengv::relative_pose::twopt_rotationOnly(
    const RelativeAdapterBase & adapter,
    const std::vector<int> & indices )
{
  assert(indices.size() > 1);
  return twopt_rotationOnly( adapter, indices[0], indices[1] );
}